

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O3

void __thiscall QAccessibleTextEdit::scrollToSubstring(QAccessibleTextEdit *this)

{
  int in_EDX;
  int in_ESI;
  
  scrollToSubstring((QAccessibleTextEdit *)
                    &this[-1].super_QAccessibleTextWidget.super_QAccessibleWidget.
                     super_QAccessibleActionInterface,in_ESI,in_EDX);
  return;
}

Assistant:

void QAccessibleTextEdit::scrollToSubstring(int startIndex, int endIndex)
{
    QTextEdit *edit = textEdit();

    QTextCursor cursor = textCursor();
    cursor.setPosition(startIndex);
    QRect r = edit->cursorRect(cursor);

    cursor.setPosition(endIndex);
    r.setBottomRight(edit->cursorRect(cursor).bottomRight());

    r.moveTo(r.x() + edit->horizontalScrollBar()->value(),
             r.y() + edit->verticalScrollBar()->value());

    // E V I L, but ensureVisible is not public
    if (Q_UNLIKELY(!QMetaObject::invokeMethod(edit, "_q_ensureVisible", Q_ARG(QRectF, r))))
        qWarning("AccessibleTextEdit::scrollToSubstring failed!");
}